

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_runtime_api.cc
# Opt level: O1

int TVMSynchronize(int device_type,int device_id,TVMStreamHandle stream)

{
  DeviceAPIManager *this;
  DeviceAPI *pDVar1;
  
  this = tvm::runtime::DeviceAPIManager::Global();
  pDVar1 = tvm::runtime::DeviceAPIManager::GetAPI(this,device_type,false);
  (*pDVar1->_vptr_DeviceAPI[9])(pDVar1,CONCAT44(device_id,device_type),stream);
  return 0;
}

Assistant:

int TVMSynchronize(int device_type, int device_id, TVMStreamHandle stream) {
  API_BEGIN();
  TVMContext ctx;
  ctx.device_type = static_cast<DLDeviceType>(device_type);
  ctx.device_id = device_id;
  DeviceAPIManager::Get(ctx)->StreamSync(ctx, stream);
  API_END();
}